

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

void clusterDDel(vector<DirectDelNode,_std::allocator<DirectDelNode>_> *nodes,
                vector<DirectDelCluster,_std::allocator<DirectDelCluster>_> *clusters)

{
  pointer pDVar1;
  bool bVar2;
  reference pvVar3;
  ulong __n;
  pointer pDVar4;
  ulong uVar5;
  DirectDelNode n;
  DirectDelCluster dc;
  undefined1 local_c0 [40];
  DirectDelNode local_98;
  DirectDelCluster local_70;
  
  pDVar4 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pDVar1 = (nodes->super__Vector_base<DirectDelNode,_std::allocator<DirectDelNode>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pDVar4 == pDVar1) {
      return;
    }
    DirectDelNode::DirectDelNode(&local_98,pDVar4);
    uVar5 = (ulong)((long)(clusters->
                          super__Vector_base<DirectDelCluster,_std::allocator<DirectDelCluster>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(clusters->
                         super__Vector_base<DirectDelCluster,_std::allocator<DirectDelCluster>_>).
                         _M_impl.super__Vector_impl_data._M_start) >> 6 & 0xffffffff;
    do {
      uVar5 = uVar5 - 1;
      if ((int)(uint)uVar5 < 0) {
LAB_00199663:
        DirectDelNode::DirectDelNode((DirectDelNode *)local_c0,&local_98);
        DirectDelCluster::DirectDelCluster(&local_70,(DirectDelNode *)local_c0);
        std::__cxx11::string::~string((string *)(local_c0 + 8));
        std::vector<DirectDelCluster,std::allocator<DirectDelCluster>>::
        emplace_back<DirectDelCluster&>
                  ((vector<DirectDelCluster,std::allocator<DirectDelCluster>> *)clusters,&local_70);
        DirectDelCluster::~DirectDelCluster(&local_70);
        goto LAB_001996a0;
      }
      __n = (ulong)((uint)uVar5 & 0x7fffffff);
      pvVar3 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at(clusters,__n);
      bVar2 = std::operator!=(&(pvVar3->info).refName,&local_98.refName);
      if (bVar2) goto LAB_00199663;
      pvVar3 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at(clusters,__n);
      bVar2 = checkRO(&pvVar3->info,&local_98);
    } while (!bVar2);
    pvVar3 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at(clusters,__n);
    std::vector<DirectDelNode,std::allocator<DirectDelNode>>::emplace_back<DirectDelNode&>
              ((vector<DirectDelNode,std::allocator<DirectDelNode>> *)&pvVar3->nodes,&local_98);
LAB_001996a0:
    std::__cxx11::string::~string((string *)&local_98.refName);
    pDVar4 = pDVar4 + 1;
  } while( true );
}

Assistant:

void clusterDDel(const std::vector<DirectDelNode> &nodes, std::vector<DirectDelCluster> &clusters)
{
	for (DirectDelNode n : nodes)
	{
		bool found = false;
		for (int i = clusters.size() - 1; i >= 0; i--)
		{
			// diff chr
			if (clusters.at(i).info.refName != n.refName)
				break;
			if (checkRO(clusters.at(i).info, n))
			{
				// push new node
				clusters.at(i).nodes.emplace_back(n);
				found = true;
				break;
			}
		}
		// add new cluster
		if (!found)
		{
			DirectDelCluster dc(n);
			clusters.emplace_back(dc);
		}
	}
}